

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O3

Player * __thiscall Gameplay::checkWinningCondition(Gameplay *this)

{
  int iVar1;
  Stronghold *this_00;
  string *psVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  Player *pPVar5;
  Gameplay *pGVar6;
  
  pGVar6 = (Gameplay *)
           (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
           super__List_node_base._M_next;
  (this->it)._M_node = (_List_node_base *)pGVar6;
  if (pGVar6 != this) {
    do {
      iVar1 = Player::getNumberOfProvinces
                        ((Player *)
                         &(pGVar6->players).super__List_base<Player,_std::allocator<Player>_>.
                          _M_impl._M_node._M_size);
      if (iVar1 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
        this_00 = Player::getStronghold((Player *)((this->it)._M_node + 1));
        psVar2 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(psVar2->_M_dataplus)._M_p,
                            psVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"lost.",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::__cxx11::list<Player,_std::allocator<Player>_>::remove
                  (&this->players,(char *)((this->it)._M_node + 1));
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"players remaining.",0x12);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        p_Var4 = (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        (this->it)._M_node = p_Var4;
      }
      else {
        p_Var4 = (this->it)._M_node;
      }
      pGVar6 = (Gameplay *)p_Var4->_M_next;
      (this->it)._M_node = (_List_node_base *)pGVar6;
    } while (pGVar6 != this);
    pGVar6 = (Gameplay *)
             (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
             super__List_node_base._M_next;
  }
  pPVar5 = (Player *)0x0;
  if ((this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node._M_size == 1
     ) {
    pPVar5 = (Player *)
             &(pGVar6->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
              _M_size;
  }
  return pPVar5;
}

Assistant:

Player *Gameplay::checkWinningCondition()                       //if someone won returns a pointer to that player else returns null
{                                                               //prints if someone lost and removes him from the list
    for (it=players.begin(); it!=players.end(); it++)
    {
        if (!it->getNumberOfProvinces())
        {
            cout << "Player "<<it->getStronghold()->getName()<<"lost." << endl;

            players.remove(*it);
            cout << players.size() <<"players remaining." << endl;

            it=players.begin();
        }
    }
    if (players.size() == 1)
        return &*players.begin();

    return nullptr;
}